

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O3

bool amrex::is_integer(char *str)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (str == (char *)0x0) {
    return false;
  }
  sVar3 = strlen(str);
  uVar2 = (uint)sVar3;
  if (uVar2 == 0) {
LAB_0051e52b:
    bVar1 = false;
  }
  else if ((int)uVar2 < 1) {
    bVar1 = true;
  }
  else {
    uVar4 = 0;
    do {
      if (9 < (int)str[uVar4] - 0x30U) goto LAB_0051e52b;
      uVar4 = uVar4 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar4);
    bVar1 = (uVar2 & 0x7fffffff) <= uVar4;
  }
  return bVar1;
}

Assistant:

bool
amrex::is_integer (const char* str)
{
    int len = 0;

    if (str == 0 || (len = strlen(str)) == 0)
        return false;

    for (int i = 0; i < len; i++)
        if (!isdigit(str[i]))
            return false;

    return true;
}